

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.cpp
# Opt level: O0

Tick Js::Tick::FromMicroseconds(uint64 luTime)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  uint64 luTick;
  uint64 luMaxTick;
  uint64 luTime_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = s_luFreq;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < luTime) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Tick.cpp"
                                ,0x4d,"(luTime <= luMaxTick)",
                                "Ensure time can be converted losslessly");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Tick((Tick *)&luTime_local,(luTime * s_luFreq) / 1000000);
  return (Tick)luTime_local;
}

Assistant:

Tick
    Tick::FromMicroseconds(
        uint64 luTime)                          // Time, in microseconds
    {
        //
        // Ensure we can convert losslessly.
        //

#if DBG
        const uint64 luMaxTick = _UI64_MAX / s_luFreq;
        AssertMsg(luTime <= luMaxTick, "Ensure time can be converted losslessly");
#endif // DBG


        //
        // Create the Tick
        //

        uint64 luTick = luTime * s_luFreq / ((uint64) 1000000);
        return Tick(luTick);
    }